

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::auto_manage_checking_torrents
          (session_impl *this,
          vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *list,
          int *limit)

{
  torrent *this_00;
  bool bVar1;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> local_41;
  reference local_40;
  torrent **t;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *__range2;
  int *limit_local;
  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *list_local;
  session_impl *this_local;
  
  __end2 = ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
           begin(list);
  t = (torrent **)
      ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::end
                (list);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::aux::torrent_**,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                                     *)&t), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::torrent_**,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
               ::operator*(&__end2);
    if (*limit < 1) {
      this_00 = *local_40;
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
      bitfield_flag(&local_41);
      torrent::pause(this_00);
    }
    else {
      torrent::resume(*local_40);
      bVar1 = torrent::should_check_files(*local_40);
      if (bVar1) {
        torrent::start_checking(*local_40);
        *limit = *limit + -1;
      }
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::torrent_**,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void session_impl::auto_manage_checking_torrents(std::vector<torrent*>& list
		, int& limit)
	{
		for (auto& t : list)
		{
			TORRENT_ASSERT(t->state() == torrent_status::checking_files);
			TORRENT_ASSERT(t->is_auto_managed());
			if (limit <= 0)
			{
				t->pause();
			}
			else
			{
				t->resume();
				if (!t->should_check_files()) continue;
				t->start_checking();
				--limit;
			}
		}
	}